

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_traits.h
# Opt level: O2

void google::protobuf::json_internal::ParseProto2Descriptor::SetInt64(Field f,Msg *msg,int64_t x)

{
  bool bVar1;
  Metadata MVar2;
  
  RecordAsSeen(f,msg);
  bVar1 = FieldDescriptor::is_repeated(f);
  MVar2 = Message::GetMetadata(msg->msg_);
  if (bVar1) {
    Reflection::AddInt64(MVar2.reflection,msg->msg_,f,x);
    return;
  }
  Reflection::SetInt64(MVar2.reflection,msg->msg_,f,x);
  return;
}

Assistant:

static void SetInt64(Field f, Msg& msg, int64_t x) {
    RecordAsSeen(f, msg);
    if (f->is_repeated()) {
      msg.msg_->GetReflection()->AddInt64(msg.msg_, f, x);
    } else {
      msg.msg_->GetReflection()->SetInt64(msg.msg_, f, x);
    }
  }